

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O2

void output(vector<double,_std::allocator<double>_> *Ea,vector<double,_std::allocator<double>_> *ca,
           int simulations,double E_exact,double c_exact)

{
  long lVar1;
  pointer pdVar2;
  pointer pdVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int j_1;
  double dVar8;
  double dVar9;
  
  lVar6 = (long)simulations;
  pdVar2 = (Ea->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pdVar2[lVar6] = 0.0;
  pdVar3 = (ca->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pdVar3[lVar6] = 0.0;
  pdVar2[lVar6 + 1] = 0.0;
  pdVar3[lVar6 + 1] = 0.0;
  lVar1 = lVar6 + 1;
  dVar8 = (double)simulations;
  uVar5 = 0;
  uVar7 = 0;
  if (0 < simulations) {
    uVar7 = (ulong)(uint)simulations;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    pdVar2[lVar6] = pdVar2[uVar5] / dVar8 + pdVar2[lVar6];
    pdVar3[lVar6] = pdVar3[uVar5] / dVar8 + pdVar3[lVar6];
  }
  for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    pdVar2[lVar1] =
         (pdVar2[uVar5] - pdVar2[lVar6]) * (pdVar2[uVar5] - pdVar2[lVar6]) + pdVar2[lVar1];
    pdVar3[lVar1] =
         (pdVar3[uVar5] - pdVar3[lVar6]) * (pdVar3[uVar5] - pdVar3[lVar6]) + pdVar3[lVar1];
  }
  dVar8 = (dVar8 + -1.0) * dVar8;
  dVar9 = pdVar2[lVar1] / dVar8;
  pdVar2[lVar1] = dVar9;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  (Ea->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start
  [lVar1] = dVar9;
  pdVar2 = (ca->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  dVar8 = pdVar2[lVar1] / dVar8;
  pdVar2[lVar1] = dVar8;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  (ca->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start
  [lVar1] = dVar8;
  std::operator<<((ostream *)&std::cout,"\n\t E\t\t c\n");
  for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,'\t');
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
    poVar4 = std::ostream::_M_insert<double>
                       ((Ea->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar5]);
    poVar4 = std::operator<<(poVar4,'\t');
    *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
    poVar4 = std::ostream::_M_insert<double>
                       ((ca->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar5]);
    std::operator<<(poVar4,'\n');
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"\t--------------\t--------------");
  poVar4 = std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<(poVar4,"mean\t");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
  poVar4 = std::ostream::_M_insert<double>
                     ((Ea->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar6]);
  poVar4 = std::operator<<(poVar4,'\t');
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
  poVar4 = std::ostream::_M_insert<double>
                     ((ca->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar6]);
  poVar4 = std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<(poVar4,"Del\t");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
  poVar4 = std::ostream::_M_insert<double>
                     ((Ea->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar6] - E_exact);
  poVar4 = std::operator<<(poVar4,'\t');
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
  poVar4 = std::ostream::_M_insert<double>
                     ((ca->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar6] - c_exact);
  poVar4 = std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<(poVar4,"sig\t");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
  poVar4 = std::ostream::_M_insert<double>
                     ((Ea->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar1]);
  poVar4 = std::operator<<(poVar4,'\t');
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
  poVar4 = std::ostream::_M_insert<double>
                     ((ca->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar1]);
  poVar4 = std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<(poVar4,"Del/sig\t");
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
  pdVar2 = (Ea->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  poVar4 = std::ostream::_M_insert<double>(ABS(pdVar2[lVar6] - E_exact) / pdVar2[lVar1]);
  poVar4 = std::operator<<(poVar4,'\t');
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 8;
  pdVar2 = (ca->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  poVar4 = std::ostream::_M_insert<double>(ABS(pdVar2[lVar6] - c_exact) / pdVar2[lVar1]);
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void output(std::vector<double> &Ea, std::vector<double> &ca, int simulations, double E_exact,
            double c_exact) {
  Ea[simulations] = 0.0;
  ca[simulations] = 0.0;
  Ea[simulations + 1] = 0.0;
  ca[simulations + 1] = 0.0;
  for (int j{0}; j < simulations; ++j) {
    Ea[simulations] += Ea[j] / simulations;
    ca[simulations] += ca[j] / simulations;
  }
  for (int j{0}; j < simulations; ++j) {
    Ea[simulations + 1] += (Ea[j] - Ea[simulations]) * (Ea[j] - Ea[simulations]);
    ca[simulations + 1] += (ca[j] - ca[simulations]) * (ca[j] - ca[simulations]);
  }
  Ea[simulations + 1] /= (simulations - 1.0) * simulations;
  Ea[simulations + 1] = std::sqrt(Ea[simulations + 1]);
  // Student_t(0.99, simulations-1l);
  ca[simulations + 1] /= (simulations - 1.0) * simulations;
  ca[simulations + 1] = std::sqrt(ca[simulations + 1]);
  // Student_t(0.99, simulations-1l);
  std::cout << "\n\t E\t\t c\n";
  for (int j{0}; j < simulations; ++j)
    std::cout << '\t' << std::setprecision(8) << Ea[j] << '\t' << std::setprecision(8) << ca[j]
              << '\n';
  std::cout << "\t--------------\t--------------" << '\n'
            << "mean\t" << std::setprecision(8) << Ea[simulations] << '\t'
            << std::setprecision(8) << ca[simulations] << '\n'
            << "Del\t" << std::setprecision(8) << Ea[simulations] - E_exact << '\t'
            << std::setprecision(8) << ca[simulations] - c_exact << '\n'
            << "sig\t" << std::setprecision(8) << Ea[simulations + 1] << '\t'
            << std::setprecision(8) << ca[simulations + 1] << '\n'
            << "Del/sig\t" << std::setprecision(8)
            << std::abs(Ea[simulations] - E_exact) / Ea[simulations + 1] << '\t'
            << std::setprecision(8) << std::abs(ca[simulations] - c_exact) / ca[simulations + 1]
            << std::endl;
}